

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

void rw::decompressDXT1(uint8 *adst,int32 w,int32 h,uint8 *src)

{
  byte bVar1;
  ulong uVar5;
  uint8 *puVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int32 k;
  long lVar11;
  byte *pbVar12;
  uint32 k_1;
  long lVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  uint local_98 [3];
  ushort local_8c [2];
  uint local_88;
  uint local_84;
  uint local_80;
  undefined4 local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  undefined8 local_6c;
  uint local_64;
  uint local_60;
  undefined4 local_5c;
  uint8 *local_58;
  ulong local_50;
  byte local_48 [24];
  uint8 idx [16];
  byte bVar2;
  byte bVar3;
  byte bVar4;
  
  if (1 < h * w) {
    uVar9 = 0;
    iVar10 = 0;
    local_50 = 0;
    local_58 = src;
    puVar6 = src;
    do {
      uVar14 = *(ushort *)(puVar6 + uVar9);
      uVar15 = *(ushort *)(puVar6 + uVar9 + 2);
      local_98[0] = ((uint)(uVar14 >> 0xb) * 0xff) / 0x1f;
      local_98[1] = ((uVar14 >> 5 & 0x3f) * 0xff) / 0x3f;
      local_98[2] = ((uVar14 & 0x1f) * 0xff) / 0x1f;
      local_8c[0] = 0xff;
      local_8c[1] = 0;
      local_88 = ((uint)(uVar15 >> 0xb) * 0xff) / 0x1f;
      local_84 = ((uVar15 >> 5 & 0x3f) * 0xff) / 0x3f;
      local_80 = ((uVar15 & 0x1f) * 0xff) / 0x1f;
      local_7c = 0xff;
      if (uVar15 < uVar14) {
        local_78 = (local_88 + local_98[0] * 2) / 3;
        local_74 = (local_84 + local_98[1] * 2) / 3;
        local_70 = (local_80 + local_98[2] * 2) / 3;
        local_6c = CONCAT44((local_98[0] + local_88 * 2) / 3,0xff);
        local_64 = (local_98[1] + local_84 * 2) / 3;
        local_60 = (local_98[2] + local_80 * 2) / 3;
        local_5c = 0xff;
      }
      else {
        local_78 = local_88 + local_98[0] >> 1;
        local_74 = local_84 + local_98[1] >> 1;
        local_70 = local_80 + local_98[2] >> 1;
        local_6c = 0xff;
        local_64 = 0;
        local_60 = 0;
        local_5c = 0;
      }
      uVar7 = *(uint *)(src + uVar9 + 4);
      lVar11 = 0;
      do {
        local_48[lVar11] = (byte)uVar7 & 3;
        uVar7 = uVar7 >> 2;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x10);
      iVar8 = w * (int)local_50 + iVar10;
      pbVar12 = local_48;
      lVar11 = 0;
      do {
        lVar13 = 0;
        do {
          uVar5 = (ulong)pbVar12[lVar13];
          uVar14 = (ushort)local_98[uVar5 * 4] & 0xff;
          uVar15 = (ushort)local_98[uVar5 * 4 + 1] & 0xff;
          uVar16 = local_8c[uVar5 * 8 + -2] & 0xff;
          uVar17 = local_8c[uVar5 * 8] & 0xff;
          bVar1 = (uVar14 != 0) * (uVar14 < 0x100) * (char)(ushort)local_98[uVar5 * 4] -
                  (0xff < uVar14);
          bVar2 = (uVar15 != 0) * (uVar15 < 0x100) * (char)(ushort)local_98[uVar5 * 4 + 1] -
                  (0xff < uVar15);
          bVar3 = (uVar16 != 0) * (uVar16 < 0x100) * (char)local_8c[uVar5 * 8 + -2] -
                  (0xff < uVar16);
          bVar4 = (uVar17 != 0) * (uVar17 < 0x100) * (char)local_8c[uVar5 * 8] - (0xff < uVar17);
          *(uint *)(adst + (ulong)(uint)(iVar8 + (int)lVar13) * 4) =
               CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                        CONCAT12((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                 CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),
                                          (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1))))
          ;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 4);
        lVar11 = lVar11 + 1;
        iVar8 = iVar8 + w;
        pbVar12 = pbVar12 + 4;
      } while (lVar11 != 4);
      iVar10 = iVar10 + 4;
      if (w <= iVar10) {
        iVar10 = 0;
        local_50 = (ulong)((int)local_50 + 4);
      }
      uVar9 = uVar9 + 8;
      puVar6 = local_58;
    } while (uVar9 < (uint)(h * w) >> 1);
  }
  return;
}

Assistant:

void
decompressDXT1(uint8 *adst, int32 w, int32 h, uint8 *src)
{
	/* j loops through old texels
	 * x and y loop through new texels */
	int32 x = 0, y = 0;
	uint32 c[4][4];
	uint8 idx[16];
	uint8 (*dst)[4] = (uint8(*)[4])adst;
	for(int32 j = 0; j < w*h/2; j += 8){
		/* calculate colors */
		uint32 col0 = *((uint16*)&src[j+0]);
		uint32 col1 = *((uint16*)&src[j+2]);
		c[0][0] = ((col0>>11) & 0x1F)*0xFF/0x1F;
		c[0][1] = ((col0>> 5) & 0x3F)*0xFF/0x3F;
		c[0][2] = ( col0      & 0x1F)*0xFF/0x1F;
		c[0][3] = 0xFF;

		c[1][0] = ((col1>>11) & 0x1F)*0xFF/0x1F;
		c[1][1] = ((col1>> 5) & 0x3F)*0xFF/0x3F;
		c[1][2] = ( col1      & 0x1F)*0xFF/0x1F;
		c[1][3] = 0xFF;
		if(col0 > col1){
			c[2][0] = (2*c[0][0] + 1*c[1][0])/3;
			c[2][1] = (2*c[0][1] + 1*c[1][1])/3;
			c[2][2] = (2*c[0][2] + 1*c[1][2])/3;
			c[2][3] = 0xFF;

			c[3][0] = (1*c[0][0] + 2*c[1][0])/3;
			c[3][1] = (1*c[0][1] + 2*c[1][1])/3;
			c[3][2] = (1*c[0][2] + 2*c[1][2])/3;
			c[3][3] = 0xFF;
		}else{
			c[2][0] = (c[0][0] + c[1][0])/2;
			c[2][1] = (c[0][1] + c[1][1])/2;
			c[2][2] = (c[0][2] + c[1][2])/2;
			c[2][3] = 0xFF;

			c[3][0] = 0x00;
			c[3][1] = 0x00;
			c[3][2] = 0x00;
			c[3][3] = 0x00;
		}

		/* make index list */
		uint32 indices = *((uint32*)&src[j+4]);
		for(int32 k = 0; k < 16; k++){
			idx[k] = indices & 0x3;
			indices >>= 2;
		}

		/* write bytes */
		for(uint32 l = 0; l < 4; l++)
			for(uint32 k = 0; k < 4; k++){
				dst[(y+l)*w + x+k][0] = c[idx[l*4+k]][0];
				dst[(y+l)*w + x+k][1] = c[idx[l*4+k]][1];
				dst[(y+l)*w + x+k][2] = c[idx[l*4+k]][2];
				dst[(y+l)*w + x+k][3] = c[idx[l*4+k]][3];
			}
		x += 4;
		if(x >= w){
			y += 4;
			x = 0;
		}
	}
}